

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

result_type
time_plain<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *r)

{
  long lVar1;
  ulong uVar2;
  result_type rVar3;
  bool bVar4;
  double extraout_XMM0_Qa;
  timer T;
  string res;
  double local_20;
  
  T._resolution = 1e-06;
  T._t.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  uVar2 = r->_M_x;
  lVar1 = 0x1000000;
  rVar3 = 0;
  while (bVar4 = lVar1 != 0, lVar1 = lVar1 + -1, bVar4) {
    uVar2 = (uVar2 * 0x41a7) % 0x7fffffff;
    rVar3 = rVar3 + uVar2;
  }
  r->_M_x = uVar2;
  timer::time(&T,(time_t *)0x7fffffff);
  local_20 = 16.777216 / extraout_XMM0_Qa;
  to_string<double>(&res,&local_20);
  while (res._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&res);
  }
  std::operator<<((ostream *)&std::cout,(string *)&res);
  std::__cxx11::string::~string((string *)&res);
  return rVar3;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}